

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale_p.h
# Opt level: O0

void __thiscall
QSystemLocale::CurrencyToStringArgument::~CurrencyToStringArgument(CurrencyToStringArgument *this)

{
  QVariant *in_RDI;
  
  QString::~QString((QString *)0x4e4eb0);
  ::QVariant::~QVariant(in_RDI);
  return;
}

Assistant:

CurrencyToStringArgument(const QVariant &v, const QString &s)
            : value(v), symbol(s) { }